

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

bool ImGui::ShowStyleSelector(char *label)

{
  bool bVar1;
  char *unaff_retaddr;
  char *in_stack_00000010;
  ImGuiStyle *in_stack_00000360;
  ImGuiStyle *in_stack_00000370;
  ImGuiStyle *in_stack_00000380;
  int in_stack_fffffffffffffffc;
  
  bVar1 = Combo(in_stack_00000010,(int *)label,unaff_retaddr,in_stack_fffffffffffffffc);
  if (bVar1) {
    if (ShowStyleSelector::style_idx == 0) {
      StyleColorsDark(in_stack_00000380);
    }
    else if (ShowStyleSelector::style_idx == 1) {
      StyleColorsLight(in_stack_00000360);
    }
    else if (ShowStyleSelector::style_idx == 2) {
      StyleColorsClassic(in_stack_00000370);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::ShowStyleSelector(const char* label)
{
    static int style_idx = -1;
    if (ImGui::Combo(label, &style_idx, "Dark\0Light\0Classic\0"))
    {
        switch (style_idx)
        {
        case 0: ImGui::StyleColorsDark(); break;
        case 1: ImGui::StyleColorsLight(); break;
        case 2: ImGui::StyleColorsClassic(); break;
        }
        return true;
    }
    return false;
}